

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::EntryLocaleCompare(RecyclableObject *function,CallInfo callInfo,...)

{
  int str1size;
  ScriptContext *pSVar1;
  EngineInterfaceObject *this;
  JavascriptFunction *pJVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  EngineExtensionObjectBase *pEVar7;
  Var pvVar8;
  char16 *string1;
  char16 *string2;
  ThreadContext *pTVar9;
  int in_stack_00000010;
  Arguments local_70;
  Arguments local_60;
  CallInfo local_50;
  CallInfo callInfo_local;
  JavascriptString *pThis;
  JavascriptString *pThat;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x551,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bbd84b;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&pThat,&local_50,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_50 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x554,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00bbd84b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if (((uint)pThat & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec3f,L"String.prototype.localeCompare");
  }
  GetThisAndSearchStringArguments
            ((ArgumentReader *)&pThat,pSVar1,L"String.prototype.localeCompare",
             (JavascriptString **)&callInfo_local,&pThis,true);
  if (((DAT_01436210 == '\x01') && (bVar4 = ScriptContext::IsIntlEnabled(pSVar1), bVar4)) &&
     (this = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             engineInterfaceObject.ptr, this != (EngineInterfaceObject *)0x0)) {
    pEVar7 = EngineInterfaceObject::GetEngineExtension(this,EngineInterfaceExtensionKind_Intl);
    pJVar2 = *(JavascriptFunction **)&pEVar7[1].hasBytecode;
    if (pJVar2 == (JavascriptFunction *)0x0) {
      JavascriptLibrary::InitializeIntlForStringPrototype
                ((pSVar1->super_ScriptContextBase).javascriptLibrary);
      pJVar2 = *(JavascriptFunction **)&pEVar7[1].hasBytecode;
      if (pJVar2 == (JavascriptFunction *)0x0) goto LAB_00bbd800;
      pTVar9 = pSVar1->threadContext;
      bVar4 = pTVar9->reentrancySafeOrHandled;
      pTVar9->reentrancySafeOrHandled = true;
      local_60.Values = (Type)args.super_Arguments.Info;
      pvVar8 = JavascriptFunction::CallFunction(pJVar2,&local_60);
    }
    else {
      pTVar9 = pSVar1->threadContext;
      bVar4 = pTVar9->reentrancySafeOrHandled;
      pTVar9->reentrancySafeOrHandled = true;
      local_70.Values = (Type)args.super_Arguments.Info;
      pvVar8 = JavascriptFunction::CallFunction(pJVar2,&local_70);
    }
    pTVar9->reentrancySafeOrHandled = bVar4;
    return pvVar8;
  }
LAB_00bbd800:
  string1 = GetString((JavascriptString *)callInfo_local);
  str1size = *(int *)((long)callInfo_local + 0x18);
  string2 = GetString(pThis);
  uVar5 = PlatformAgnostic::UnicodeText::LogicalStringCompare
                    (string1,str1size,string2,pThis->m_charLength);
  if (uVar5 != 0xfffffffe) {
    return (Var)((ulong)uVar5 | 0x1000000000000);
  }
  JavascriptError::ThrowRangeError
            ((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr,-0x7ff5ffcd,(PCWSTR)0x0);
}

Assistant:

Var JavascriptString::EntryLocaleCompare(RecyclableObject* function, CallInfo callInfo, ...)
    {
        using namespace PlatformAgnostic;

        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if(args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedString, _u("String.prototype.localeCompare"));
        }
        AssertMsg(args.Info.Count > 0, "Negative argument count");

        JavascriptString * pThis;
        JavascriptString * pThat;

        GetThisAndSearchStringArguments(args, scriptContext, _u("String.prototype.localeCompare"), &pThis, &pThat, true);

#ifdef ENABLE_INTL_OBJECT
        if (CONFIG_FLAG(IntlBuiltIns) && scriptContext->IsIntlEnabled())
        {
            EngineInterfaceObject* nativeEngineInterfaceObj = scriptContext->GetLibrary()->GetEngineInterfaceObject();
            if (nativeEngineInterfaceObj)
            {
                IntlEngineInterfaceExtensionObject* intlExtensionObject = static_cast<IntlEngineInterfaceExtensionObject*>(
                    nativeEngineInterfaceObj->GetEngineExtension(EngineInterfaceExtensionKind_Intl));

#ifdef INTL_WINGLOB
                if (args.Info.Count == 2)
                {
                    auto undefined = scriptContext->GetLibrary()->GetUndefined();
                    CallInfo toPass(callInfo.Flags, 3);
                    ThreadContext *threadContext = scriptContext->GetThreadContext();
                    return threadContext->ExecuteImplicitCall(function, ImplicitCall_Accessor,
                        [threadContext, intlExtensionObject, function, toPass, undefined, pThis, pThat]() -> Var
                        {
                            return CALL_ENTRYPOINT(threadContext, intlExtensionObject->EntryIntl_CompareString,
                                function, toPass, undefined, pThis, pThat);
                        }
                    );
                }
#endif

                // Check if String.prototype.localeCompare/Intl.Collator was already initialized
                JavascriptFunction* func = intlExtensionObject->GetStringLocaleCompare();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return func->CallFunction(args);
                    }
                    END_SAFE_REENTRANT_CALL
                }

                // String.prototype.localeCompare/Intl.Collator was not initialized yet, so we need to manually initialize it here
                scriptContext->GetLibrary()->InitializeIntlForStringPrototype();
                func = intlExtensionObject->GetStringLocaleCompare();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return func->CallFunction(args);
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
        }
#endif

        const char16* pThisStr = pThis->GetString();
        int thisStrCount = pThis->GetLength();

        const char16* pThatStr = pThat->GetString();
        int thatStrCount = pThat->GetLength();

        int result = UnicodeText::LogicalStringCompare(pThisStr, thisStrCount, pThatStr, thatStrCount);

        // LogicalStringCompare will return -2 if CompareStringEx fails.
        if (result == -2)
        {
            // TODO there is no spec on the error thrown here.
            // When the support for HR errors is implemented replace this with the same error reported by v5.8
            JavascriptError::ThrowRangeError(function->GetScriptContext(),
                VBSERR_InternalError /* TODO-ERROR: _u("Failed compare operation")*/ );
        }

        return JavascriptNumber::ToVar(result, scriptContext);
    }